

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O2

void __thiscall UdpSocketTest::Run(UdpSocketTest *this)

{
  int iVar1;
  uint32_t number;
  uint32_t new_number;
  Address client_addr;
  Address server_addr;
  Socket sock;
  ServerSocket server;
  Selector s;
  
  Selector::Selector(&s,(char *)0x0);
  JetHead::Socket::Socket(&sock,false);
  JetHead::ServerSocket::ServerSocket(&server,false);
  server_addr.mAddr.sin_family = 2;
  server_addr.mAddr.sin_port = 0;
  server_addr.mAddr.sin_addr.s_addr = 0;
  client_addr.mLen = 0x10;
  client_addr.mAddr.sin_family = 2;
  client_addr.mAddr.sin_port = 0;
  client_addr.mAddr.sin_addr.s_addr = 0;
  server_addr.mLen = client_addr.mLen;
  iVar1 = JetHead::ServerSocket::bind((Address *)&server);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x5d,"Bind Failed");
  }
  iVar1 = JetHead::Socket::getLocalAddress((Address *)&server);
  JetHead::Socket::Address::setAddress((char *)&server_addr);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,99,"get local addr failed");
  }
  JetHead::Socket::setSelector((SocketListener *)&server,(Selector *)&this->super_SocketListener);
  iVar1 = JetHead::Socket::connect((Address *)&sock);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x6b,"connect failed");
  }
  iVar1 = JetHead::Socket::getLocalAddress((Address *)&sock);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x70,"get local addr failed");
  }
  iVar1 = JetHead::Socket::connect((Address *)&server);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x75,"server connet failed");
    number = 1000;
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x7b,"connect failed");
  }
  else {
    number = 1000;
  }
  iVar1 = JetHead::Socket::write(&sock,(int)&number);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x80,"write failed");
  }
  iVar1 = JetHead::Socket::read(&sock,(int)&new_number);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x85,"read failed");
  }
  if (new_number != number + 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x88,"Data Read failed");
  }
  number = new_number + 1;
  iVar1 = JetHead::Socket::write(&sock,(int)&number);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x8f,"write failed");
  }
  iVar1 = JetHead::Socket::read(&sock,(int)&new_number);
  if (new_number != number + 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x94,"FAILED");
  }
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x97,"write failed");
  }
  this->mTestState = 0;
  JetHead::Socket::close();
  usleep(100000);
  TestCase::TestPassed(&this->super_TestCase);
  JetHead::ServerSocket::~ServerSocket(&server);
  JetHead::Socket::~Socket(&sock);
  Selector::~Selector(&s);
  return;
}

Assistant:

void UdpSocketTest::Run()
{	
	LOG_NOTICE( "UDP Test Started" );

	Selector s;

	Socket sock( false );
	ServerSocket server( false );
	Socket::Address server_addr, client_addr;
	
	int res = server.bind( server_addr );

	if ( res < 0 )
		TestFailed( "Bind Failed" );
		
	res = server.getLocalAddress( server_addr );
	server_addr.setAddress( "127.0.0.1" );
	
	if ( res < 0 )
		TestFailed( "get local addr failed" );
	
	LOG_NOTICE( "Server name %s:%d", server_addr.getName(), server_addr.getPort() );
	
	server.setSelector( this, &s );
	res = sock.connect( server_addr );

	if ( res < 0 )
		TestFailed( "connect failed" );
	
	res = sock.getLocalAddress( client_addr );

	if ( res < 0 )
		TestFailed( "get local addr failed" );

	res = server.connect( client_addr );

	if ( res < 0 )
		TestFailed( "server connet failed" );
	
	uint32_t number = 1000;
	uint32_t new_number;
	
	if ( res < 0 )
		TestFailed( "connect failed" );
	
	res = sock.write( &number, 4 );

	if ( res < 0 )
		TestFailed( "write failed" );

	res = sock.read( &new_number, 4 );

	if ( res < 0 )
		TestFailed( "read failed" );

	if ( new_number != number + 1 )
		TestFailed( "Data Read failed" );
	
	number = new_number + 1;
	
	res = sock.write( &number, 4 );

	if ( res < 0 )
		TestFailed( "write failed" );

	res = sock.read( &new_number, 4 );

	if ( new_number != number + 1 )
		TestFailed( "FAILED" );
	
	if ( res < 0 )
		TestFailed( "write failed" );
	
	LOG_NOTICE( "Data sent" );
	
	mTestState = 0;
	
	sock.close();
	usleep( 100000 );
	
	TestPassed();
}